

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O0

void cmFortranParser_RuleLineDirective(cmFortranParser *parser,char *filename)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  value_type *__x;
  allocator<char> local_39;
  string included;
  char *filename_local;
  cmFortranParser *parser_local;
  
  included.field_2._8_8_ = filename;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffffc8,filename,&local_39);
  std::allocator<char>::~allocator(&local_39);
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) &&
     (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&stack0xffffffffffffffc8),
     *pcVar3 != '<')) {
    cmsys::SystemTools::ReplaceString((string *)&stack0xffffffffffffffc8,"\\\\","\\");
    cmsys::SystemTools::ConvertToUnixSlashes((string *)&stack0xffffffffffffffc8);
    bVar1 = cmsys::SystemTools::FileExists((string *)&stack0xffffffffffffffc8,true);
    if (bVar1) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                *)&parser->Info->Includes,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&stack0xffffffffffffffc8,__x);
    }
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return;
}

Assistant:

void cmFortranParser_RuleLineDirective(cmFortranParser* parser,
                                       const char* filename)
{
  // This is a #line directive naming a file encountered during preprocessing.
  std::string included = filename;

  // Skip #line directives referencing non-files like
  // "<built-in>" or "<command-line>".
  if (included.empty() || included[0] == '<') {
    return;
  }

  // Fix windows file path separators since our lexer does not
  // process escape sequences in string literals.
  cmSystemTools::ReplaceString(included, "\\\\", "\\");
  cmSystemTools::ConvertToUnixSlashes(included);

  // Save the named file as included in the source.
  if (cmSystemTools::FileExists(included, true)) {
    parser->Info.Includes.insert(included);
  }
}